

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int ON_Font::CompareFontNameToHyphenPointer(ON_wString *lhs,ON_wString *rhs)

{
  ON_wString *rhs_local;
  ON_wString *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_wString *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_wString *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    lhs_local._4_4_ = CompareFontNameToHyphen(lhs,rhs);
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_Font::CompareFontNameToHyphenPointer(const ON_wString* lhs, const ON_wString* rhs)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_Font::CompareFontNameToHyphen(*lhs, *rhs);
}